

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O2

void __thiscall
TTD::RuntimeContextInfo::MarkWellKnownObjects_TTD(RuntimeContextInfo *this,MarkTable *marks)

{
  RecyclableObject **ppRVar1;
  FunctionBody **ppFVar2;
  int32 i;
  int iVar3;
  
  for (iVar3 = 0;
      iVar3 < (this->m_sortedObjectList).
              super_ReadOnlyList<Js::RecyclableObject_*,_Memory::HeapAllocator,_DefaultComparer>.
              count; iVar3 = iVar3 + 1) {
    ppRVar1 = JsUtil::ReadOnlyList<Js::RecyclableObject_*,_Memory::HeapAllocator,_DefaultComparer>::
              Item(&(this->m_sortedObjectList).
                    super_ReadOnlyList<Js::RecyclableObject_*,_Memory::HeapAllocator,_DefaultComparer>
                   ,iVar3);
    MarkTable::MarkAddrWithSpecialInfo<(TTD::MarkTableTag)16>(marks,*ppRVar1);
  }
  for (iVar3 = 0;
      iVar3 < (this->m_sortedFunctionBodyList).
              super_ReadOnlyList<Js::FunctionBody_*,_Memory::HeapAllocator,_DefaultComparer>.count;
      iVar3 = iVar3 + 1) {
    ppFVar2 = JsUtil::ReadOnlyList<Js::FunctionBody_*,_Memory::HeapAllocator,_DefaultComparer>::Item
                        (&(this->m_sortedFunctionBodyList).
                          super_ReadOnlyList<Js::FunctionBody_*,_Memory::HeapAllocator,_DefaultComparer>
                         ,iVar3);
    MarkTable::MarkAddrWithSpecialInfo<(TTD::MarkTableTag)16>(marks,*ppFVar2);
  }
  return;
}

Assistant:

void RuntimeContextInfo::MarkWellKnownObjects_TTD(MarkTable& marks) const
    {
        for(int32 i = 0; i < this->m_sortedObjectList.Count(); ++i)
        {
            Js::RecyclableObject* obj = this->m_sortedObjectList.Item(i);
            marks.MarkAddrWithSpecialInfo<MarkTableTag::JsWellKnownObj>(obj);
        }

        for(int32 i = 0; i < this->m_sortedFunctionBodyList.Count(); ++i)
        {
            Js::FunctionBody* body = this->m_sortedFunctionBodyList.Item(i);
            marks.MarkAddrWithSpecialInfo<MarkTableTag::JsWellKnownObj>(body);
        }
    }